

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O0

JsonParser * __thiscall
JFSON::(anonymous_namespace)::JsonParser::parse_string_abi_cxx11_(JsonParser *this)

{
  size_t sVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  JsonParser *in_RSI;
  allocator local_1d1;
  JFSON local_1d0 [32];
  string local_1b0 [32];
  long local_190;
  long codepoint;
  string local_180 [32];
  ulong local_160;
  size_t j;
  string local_150 [32];
  string local_130 [8];
  string esc;
  allocator local_10a;
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  JFSON local_e0 [32];
  string local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [35];
  char local_7d;
  int local_7c;
  char ch;
  allocator local_61;
  string local_60 [32];
  long local_40;
  long last_escaped_codepoint;
  string out;
  JsonParser *this_local;
  
  std::__cxx11::string::string((string *)&last_escaped_codepoint);
  local_40 = -1;
  while( true ) {
    sVar1 = in_RSI->i;
    sVar3 = std::__cxx11::string::size();
    if (sVar1 == sVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,"unexpected end of input in string",&local_61);
      pcVar4 = fail<char_const*>((JsonParser *)in_RSI,(string *)local_60,"");
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,pcVar4,(allocator *)&ch);
      std::allocator<char>::~allocator((allocator<char> *)&ch);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
      local_7c = 1;
      goto LAB_00108022;
    }
    in_RSI->i = in_RSI->i + 1;
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI->str);
    local_7d = *pcVar4;
    if (local_7d == '\"') break;
    bVar2 = in_range((long)local_7d,0,0x1f);
    if (bVar2) {
      esc_abi_cxx11_(local_e0,local_7d);
      std::operator+((char *)local_c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "unescaped ");
      std::operator+(local_a0,(char *)local_c0);
      pcVar4 = fail<char_const*>((JsonParser *)in_RSI,local_a0,"");
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,pcVar4,&local_e1);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      std::__cxx11::string::~string((string *)local_a0);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string((string *)local_e0);
      local_7c = 1;
      goto LAB_00108022;
    }
    if (local_7d == '\\') {
      sVar1 = in_RSI->i;
      sVar3 = std::__cxx11::string::size();
      if (sVar1 == sVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_108,"unexpected end of input in string",&local_109);
        pcVar4 = fail<char_const*>((JsonParser *)in_RSI,(string *)local_108,"");
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)this,pcVar4,&local_10a);
        std::allocator<char>::~allocator((allocator<char> *)&local_10a);
        std::__cxx11::string::~string(local_108);
        std::allocator<char>::~allocator((allocator<char> *)&local_109);
        local_7c = 1;
        goto LAB_00108022;
      }
      in_RSI->i = in_RSI->i + 1;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI->str);
      local_7d = *pcVar4;
      if (local_7d == 'u') {
        std::__cxx11::string::substr((ulong)local_130,(ulong)in_RSI->str);
        uVar5 = std::__cxx11::string::length();
        if (uVar5 < 4) {
          std::operator+((char *)local_150,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "bad \\u escape: ");
          pcVar4 = fail<char_const*>((JsonParser *)in_RSI,local_150,"");
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)this,pcVar4,(allocator *)((long)&j + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&j + 7));
          std::__cxx11::string::~string((string *)local_150);
          local_7c = 1;
        }
        else {
          for (local_160 = 0; local_160 < 4; local_160 = local_160 + 1) {
            pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_130);
            bVar2 = in_range((long)*pcVar4,0x61,0x66);
            if (!bVar2) {
              pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_130);
              bVar2 = in_range((long)*pcVar4,0x41,0x46);
              if (!bVar2) {
                pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_130);
                bVar2 = in_range((long)*pcVar4,0x30,0x39);
                if (!bVar2) {
                  std::operator+((char *)local_180,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)"bad \\u escape: ");
                  pcVar4 = fail<char_const*>((JsonParser *)in_RSI,local_180,"");
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)this,pcVar4,(allocator *)((long)&codepoint + 7));
                  std::allocator<char>::~allocator((allocator<char> *)((long)&codepoint + 7));
                  std::__cxx11::string::~string((string *)local_180);
                  local_7c = 1;
                  goto LAB_00107e07;
                }
              }
            }
          }
          pcVar4 = (char *)std::__cxx11::string::data();
          local_190 = strtol(pcVar4,(char **)0x0,0x10);
          bVar2 = in_range(local_40,0xd800,0xdbff);
          if ((bVar2) && (bVar2 = in_range(local_190,0xdc00,0xdfff), bVar2)) {
            anon_unknown_21::JsonParser::encode_utf8
                      (in_RSI,(local_40 * 0x400 - 0x3600000U | local_190 - 0xdc00U) + 0x10000,
                       (string *)&last_escaped_codepoint);
            local_40 = -1;
          }
          else {
            anon_unknown_21::JsonParser::encode_utf8
                      (in_RSI,local_40,(string *)&last_escaped_codepoint);
            local_40 = local_190;
          }
          in_RSI->i = in_RSI->i + 4;
          local_7c = 2;
        }
LAB_00107e07:
        std::__cxx11::string::~string(local_130);
        if (local_7c != 2) {
LAB_00108022:
          std::__cxx11::string::~string((string *)&last_escaped_codepoint);
          return this;
        }
      }
      else {
        anon_unknown_21::JsonParser::encode_utf8(in_RSI,local_40,(string *)&last_escaped_codepoint);
        local_40 = -1;
        if (local_7d == 'b') {
          std::__cxx11::string::operator+=((string *)&last_escaped_codepoint,'\b');
        }
        else if (local_7d == 'f') {
          std::__cxx11::string::operator+=((string *)&last_escaped_codepoint,'\f');
        }
        else if (local_7d == 'n') {
          std::__cxx11::string::operator+=((string *)&last_escaped_codepoint,'\n');
        }
        else if (local_7d == 'r') {
          std::__cxx11::string::operator+=((string *)&last_escaped_codepoint,'\r');
        }
        else if (local_7d == 't') {
          std::__cxx11::string::operator+=((string *)&last_escaped_codepoint,'\t');
        }
        else {
          if (((local_7d != '\"') && (local_7d != '\\')) && (local_7d != '/')) {
            esc_abi_cxx11_(local_1d0,local_7d);
            std::operator+((char *)local_1b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "invalid escape character ");
            pcVar4 = fail<char_const*>((JsonParser *)in_RSI,local_1b0,"");
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)this,pcVar4,&local_1d1);
            std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
            std::__cxx11::string::~string((string *)local_1b0);
            std::__cxx11::string::~string((string *)local_1d0);
            local_7c = 1;
            goto LAB_00108022;
          }
          std::__cxx11::string::operator+=((string *)&last_escaped_codepoint,local_7d);
        }
      }
    }
    else {
      anon_unknown_21::JsonParser::encode_utf8(in_RSI,local_40,(string *)&last_escaped_codepoint);
      local_40 = -1;
      std::__cxx11::string::operator+=((string *)&last_escaped_codepoint,local_7d);
    }
  }
  anon_unknown_21::JsonParser::encode_utf8(in_RSI,local_40,(string *)&last_escaped_codepoint);
  std::__cxx11::string::string((string *)this,(string *)&last_escaped_codepoint);
  local_7c = 1;
  goto LAB_00108022;
}

Assistant:

string parse_string() {
        string out;
        long last_escaped_codepoint = -1;
        while (true) {
            if (i == str.size())
                return fail("unexpected end of input in string", "");

            char ch = str[i++];

            if (ch == '"') {
                encode_utf8(last_escaped_codepoint, out);
                return out;
            }

            if (in_range(ch, 0, 0x1f))
                return fail("unescaped " + esc(ch) + " in string", "");

            // The usual case: non-escaped characters
            if (ch != '\\') {
                encode_utf8(last_escaped_codepoint, out);
                last_escaped_codepoint = -1;
                out += ch;
                continue;
            }

            // Handle escapes
            if (i == str.size())
                return fail("unexpected end of input in string", "");

            ch = str[i++];

            if (ch == 'u') {
                // Extract 4-byte escape sequence
                string esc = str.substr(i, 4);
                // Explicitly check length of the substring. The following loop
                // relies on std::string returning the terminating NUL when
                // accessing str[length]. Checking here reduces brittleness.
                if (esc.length() < 4) {
                    return fail("bad \\u escape: " + esc, "");
                }
                for (size_t j = 0; j < 4; j++) {
                    if (!in_range(esc[j], 'a', 'f') && !in_range(esc[j], 'A', 'F')
                            && !in_range(esc[j], '0', '9'))
                        return fail("bad \\u escape: " + esc, "");
                }

                long codepoint = strtol(esc.data(), nullptr, 16);

                // JSON specifies that characters outside the BMP shall be encoded as a pair
                // of 4-hex-digit \u escapes encoding their surrogate pair components. Check
                // whether we're in the middle of such a beast: the previous codepoint was an
                // escaped lead (high) surrogate, and this is a trail (low) surrogate.
                if (in_range(last_escaped_codepoint, 0xD800, 0xDBFF)
                        && in_range(codepoint, 0xDC00, 0xDFFF)) {
                    // Reassemble the two surrogate pairs into one astral-plane character, per
                    // the UTF-16 algorithm.
                    encode_utf8((((last_escaped_codepoint - 0xD800) << 10)
                                 | (codepoint - 0xDC00)) + 0x10000, out);
                    last_escaped_codepoint = -1;
                } else {
                    encode_utf8(last_escaped_codepoint, out);
                    last_escaped_codepoint = codepoint;
                }

                i += 4;
                continue;
            }

            encode_utf8(last_escaped_codepoint, out);
            last_escaped_codepoint = -1;

            if (ch == 'b') {
                out += '\b';
            } else if (ch == 'f') {
                out += '\f';
            } else if (ch == 'n') {
                out += '\n';
            } else if (ch == 'r') {
                out += '\r';
            } else if (ch == 't') {
                out += '\t';
            } else if (ch == '"' || ch == '\\' || ch == '/') {
                out += ch;
            } else {
                return fail("invalid escape character " + esc(ch), "");
            }
        }
    }